

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp-wasm-c-api.cc
# Opt level: O2

void wasm_val_copy(wasm_val_t *out,wasm_val_t *in)

{
  RefPtr<wabt::interp::Object> *other;
  anon_union_8_5_30786955_for_of aVar1;
  undefined7 uVar2;
  FILE *pFVar3;
  RefPtr<wabt::interp::Object> *this;
  TypedValue *tv;
  TypedValue *tv_00;
  TypedValue TStack_68;
  string local_50;
  
  pFVar3 = _stderr;
  ToWabtValue(&TStack_68,in);
  wabt::interp::TypedValueToString_abi_cxx11_(&local_50,(interp *)&TStack_68,tv);
  fprintf(pFVar3,"CAPI: [%s] %s\n","wasm_val_copy",local_50._M_dataplus._M_p);
  std::__cxx11::string::_M_dispose();
  if ((char)in->kind < '\0') {
    out->kind = in->kind;
    other = &((in->of).ref)->I;
    if (other == (RefPtr<wabt::interp::Object> *)0x0) {
      this = (RefPtr<wabt::interp::Object> *)0x0;
    }
    else {
      this = (RefPtr<wabt::interp::Object> *)operator_new(0x18);
      wabt::interp::RefPtr<wabt::interp::Object>::RefPtr(this,other);
    }
    (out->of).i64 = (int64_t)this;
  }
  else {
    uVar2 = *(undefined7 *)&in->field_0x1;
    aVar1 = in->of;
    out->kind = in->kind;
    *(undefined7 *)&out->field_0x1 = uVar2;
    out->of = aVar1;
  }
  pFVar3 = _stderr;
  ToWabtValue(&TStack_68,out);
  wabt::interp::TypedValueToString_abi_cxx11_(&local_50,(interp *)&TStack_68,tv_00);
  fprintf(pFVar3,"CAPI: [%s] -> %p %s\n","wasm_val_copy",out,local_50._M_dataplus._M_p);
  std::__cxx11::string::_M_dispose();
  return;
}

Assistant:

void wasm_val_copy(own wasm_val_t* out, const wasm_val_t* in) {
  TRACE("%s", TypedValueToString(ToWabtValue(*in)).c_str());
  if (wasm_valkind_is_ref(in->kind)) {
    out->kind = in->kind;
    out->of.ref = in->of.ref ? new wasm_ref_t{*in->of.ref} : nullptr;
  } else {
    *out = *in;
  }
  TRACE("-> %p %s", out, TypedValueToString(ToWabtValue(*out)).c_str());
}